

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O0

void __thiscall embree::Tutorial::~Tutorial(Tutorial *this)

{
  void *in_RDI;
  
  ~Tutorial((Tutorial *)0x138148);
  ::operator_delete(in_RDI);
  return;
}

Assistant:

Tutorial()
      : TutorialApplication("collide",FEATURE_RTCORE)
    {
      registerOption("benchmark-collision", [] (Ref<ParseStream> cin, const FileName& path) {
          benchmark = true;
        }, "--benchmark-collision: benchmarks collision detection");

      registerOption("complexity", [] (Ref<ParseStream> cin, const FileName& path) {
          int N = cin->getInt();
          numPhi = N;
          numTheta = 2*numPhi;
          NX = N;
          NZ = N;
        }, "--complexity: sets grid and sphere geometric complexity");
                       
      camera.from = Vec3fa(-2.5f,2.5f,-2.5f);
      camera.to   = Vec3fa(0.0f,0.0f,0.0f);
    }